

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utp_stream.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::utp_socket_impl::maybe_trigger_send_callback(utp_socket_impl *this,error_code *ec)

{
  utp_stream *s;
  bool bVar1;
  state_t sVar2;
  unsigned_long bytes_transferred;
  error_category *local_38;
  _func_int **local_28;
  error_code error_to_report;
  error_code *ec_local;
  utp_socket_impl *this_local;
  
  if (((this->m_write_handler & 1U) != 0) &&
     ((error_to_report.cat_ = (error_category *)ec, this->m_written != 0 ||
      (bVar1 = boost::system::error_code::operator_cast_to_bool(ec), bVar1)))) {
    this->m_write_handler = false;
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)error_to_report.cat_);
    if (bVar1) {
      local_38 = error_to_report.cat_;
    }
    else {
      local_38 = (error_category *)&this->m_error;
    }
    local_28 = local_38->_vptr_error_category;
    error_to_report._0_8_ = local_38->id_;
    s = this->m_userdata;
    bytes_transferred = numeric_cast<unsigned_long,int,void>(this->m_written);
    utp_stream::on_write(s,bytes_transferred,(error_code *)&local_28,false);
    this->m_written = 0;
    this->m_write_buffer_size = 0;
    ::std::vector<libtorrent::span<const_char>,_std::allocator<libtorrent::span<const_char>_>_>::
    clear(&this->m_write_buffer);
    if ((((*(ushort *)&this->field_0x21c >> 6 & 1) != 0) &&
        (bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->m_nagle_packet),
        !bVar1)) && (sVar2 = state(this), sVar2 == connected)) {
      send_fin(this);
    }
  }
  return;
}

Assistant:

void utp_socket_impl::maybe_trigger_send_callback(error_code const& ec)
{
	INVARIANT_CHECK;

	if (m_write_handler == false) return;

	// nothing has been written
	if (m_written == 0 && !ec) return;

	UTP_LOGV("%8p: calling write handler written:%d\n", static_cast<void*>(this), m_written);

	m_write_handler = false;
	error_code const error_to_report = ec ? ec : m_error;
	utp_stream::on_write(m_userdata, aux::numeric_cast<std::size_t>(m_written), error_to_report, false);
	m_written = 0;
	m_write_buffer_size = 0;
	m_write_buffer.clear();
	if (m_out_eof
		&& !m_nagle_packet
		&& state() == state_t::connected)
		send_fin();
}